

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          String *params_1,FixedArray<char,_1UL> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *__n;
  size_t result;
  size_t sVar3;
  long lVar4;
  size_t result_2;
  char *pcVar5;
  String local_98;
  char *local_80;
  size_t local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  size_t local_60;
  size_t sStack_58;
  size_t local_50;
  size_t sStack_48;
  ArrayPtr<const_char> *local_40;
  StringTree *local_38;
  
  sVar3 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_80 = (this->text).content.ptr;
  local_78 = params->size_ - 1;
  if (params->size_ == 0) {
    local_78 = sVar3;
  }
  local_70 = 1;
  uStack_68 = *(undefined8 *)(params_2 + 8);
  local_60 = params_3->size_;
  sStack_58 = params_4->size_;
  local_50 = params_5->size_;
  sStack_48 = params_6->size_;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_80 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x40);
  __return_storage_ptr__->size_ = sVar3;
  local_78 = 0;
  local_70 = 1;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_80 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x40);
  local_38 = this;
  heapString(&local_98,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  local_40 = params;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_98.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_98.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_98.content.disposer;
  local_80 = (char *)0x0;
  local_78 = 1;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0;
  sStack_58 = 0;
  local_50 = 0;
  sStack_48 = 0;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_80 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x40);
  local_98.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_98.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_98.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_98.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_98.content.size_;
  (__return_storage_ptr__->branches).disposer = local_98.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (local_38->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pcVar5,(void *)local_38->size_,(size_t)__n);
    pcVar5 = pcVar5 + (long)__n;
  }
  fill<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar5,0,(String *)local_40,(FixedArray<char,_1UL> *)params_1,
             (ArrayPtr<const_char> *)params_2,params_3,params_4,params_5,params_6);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}